

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

string * __thiscall
punky::tok::type_to_string_abi_cxx11_(string *__return_storage_ptr__,tok *this,TokenType *type)

{
  char *__s;
  allocator<char> local_9;
  
  switch(*(undefined4 *)this) {
  case 0:
    __s = "(";
    break;
  case 1:
    __s = "RIGHT_PAREN";
    break;
  case 2:
    __s = "LEFT_BRACKET";
    break;
  case 3:
    __s = "RIGHT_BRACKET";
    break;
  case 4:
    __s = "LEFT_BRACE";
    break;
  case 5:
    __s = "RIGHT_BRACE";
    break;
  case 6:
    __s = "COMMA";
    break;
  case 7:
    __s = "DOT";
    break;
  case 8:
    __s = "-";
    break;
  case 9:
    __s = "+";
    break;
  case 10:
    __s = "/";
    break;
  case 0xb:
    __s = "*";
    break;
  case 0xc:
    __s = ":";
    break;
  case 0xd:
    __s = ";";
    break;
  case 0xe:
    __s = "!";
    break;
  case 0xf:
    __s = "!=";
    break;
  case 0x10:
    __s = "=";
    break;
  case 0x11:
    __s = "==";
    break;
  case 0x12:
    __s = ">";
    break;
  case 0x13:
    __s = ">=";
    break;
  case 0x14:
    __s = "<";
    break;
  case 0x15:
    __s = "<=";
    break;
  case 0x16:
    __s = "IDENTIFIER";
    break;
  case 0x17:
    __s = "STRING";
    break;
  case 0x18:
    __s = "INT";
    break;
  case 0x19:
    __s = "fn";
    break;
  case 0x1a:
    __s = "let";
    break;
  case 0x1b:
    __s = "true";
    break;
  case 0x1c:
    __s = "false";
    break;
  case 0x1d:
    __s = "if";
    break;
  case 0x1e:
    __s = "ELSE";
    break;
  case 0x1f:
    __s = "return";
    break;
  case 0x20:
    __s = "ILLEGAL";
    break;
  case 0x21:
    __s = "EOS";
    break;
  default:
    __s = "DEFAULT - UNREACHABLE";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string type_to_string(const TokenType& type)
{
    switch (type)
    {
        case TokenType::LeftParen:
            return "(";
        case TokenType::RightParen:
            return "RIGHT_PAREN";
        case TokenType::LeftBracket:
            return "LEFT_BRACKET";
        case TokenType::RightBracket:
            return "RIGHT_BRACKET";
        case TokenType::LeftBrace:
            return "LEFT_BRACE";
        case TokenType::RightBrace:
            return "RIGHT_BRACE";
        case TokenType::Comma:
            return "COMMA";
        case TokenType::Dot:
            return "DOT";
        case TokenType::Minus:
            return "-";
        case TokenType::Plus:
            return "+";
        case TokenType::Slash:
            return "/";
        case TokenType::Asterisk:
            return "*";
        case TokenType::Colon:
            return ":";
        case TokenType::Semicolon:
            return ";";
        case TokenType::Bang:
            return "!";
        case TokenType::BangEqual:
            return "!=";
        case TokenType::Equal:
            return "=";
        case TokenType::EqualEqual:
            return "==";
        case TokenType::Greater:
            return ">";
        case TokenType::GreaterEqual:
            return ">=";
        case TokenType::Less:
            return "<";
        case TokenType::LessEqual:
            return "<=";
        case TokenType::Identifier:
            return "IDENTIFIER";
        case TokenType::String:
            return "STRING";
        case TokenType::Int:
            return "INT";
        case TokenType::Func:
            return "fn";
        case TokenType::Let:
            return "let";
        case TokenType::True:
            return "true";
        case TokenType::False:
            return "false";
        case TokenType::If:
            return "if";
        case TokenType::Else:
            return "ELSE";
        case TokenType::Return:
            return "return";
        case TokenType::Illegal:
            return "ILLEGAL";
        case TokenType::EOS:
            return "EOS";
        default:
            return "DEFAULT - UNREACHABLE";
    }
}